

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O1

void __thiscall adios2::query::RangeTree::Print(RangeTree *this)

{
  pointer *ppRVar1;
  pointer pRVar2;
  pointer pcVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  Range leaf;
  undefined1 local_68 [8];
  vector<adios2::query::Range,_std::allocator<adios2::query::Range>_> local_60;
  vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_> local_48;
  
  pRVar5 = (this->m_Leaves).
           super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (this->m_Leaves).
           super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar2) {
    ppRVar1 = &local_60.
               super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_68._0_4_ = pRVar5->m_Op;
      pcVar3 = (pRVar5->m_StrValue)._M_dataplus._M_p;
      local_60.super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppRVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + (pRVar5->m_StrValue)._M_string_length);
      Range::Print((Range *)local_68);
      if (local_60.super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)ppRVar1) {
        operator_delete(local_60.
                        super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != pRVar2);
  }
  pRVar6 = (this->m_SubNodes).
           super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (this->m_SubNodes).
           super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar4) {
    do {
      local_68._0_4_ = pRVar6->m_Relation;
      std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::vector
                (&local_60,&pRVar6->m_Leaves);
      std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::vector
                (&local_48,&pRVar6->m_SubNodes);
      Print((RangeTree *)local_68);
      std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::~vector
                (&local_48);
      std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::~vector(&local_60);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar4);
  }
  return;
}

Assistant:

void Print()
    {
        for (auto leaf : m_Leaves)
            leaf.Print();
        for (auto node : m_SubNodes)
            node.Print();
    }